

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * compatibilityType_abi_cxx11_(string *__return_storage_ptr__,CompatibleType t)

{
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  CompatibleType local_14;
  string *psStack_10;
  CompatibleType t_local;
  
  local_14 = t;
  psStack_10 = __return_storage_ptr__;
  switch(t) {
  case BoolType:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Boolean compatibility",&local_15)
    ;
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
    break;
  case StringType:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"String compatibility",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case NumberMinType:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"Numeric minimum compatibility",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case NumberMaxType:
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"Numeric maximum compatibility",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  default:
    __assert_fail("0 && \"Unreachable!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x1008,"std::string compatibilityType(CompatibleType)");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string compatibilityType(CompatibleType t)
{
  switch(t)
    {
    case BoolType:
      return "Boolean compatibility";
    case StringType:
      return "String compatibility";
    case NumberMaxType:
      return "Numeric maximum compatibility";
    case NumberMinType:
      return "Numeric minimum compatibility";
    }
  assert(0 && "Unreachable!");
  return "";
}